

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void google::protobuf::compiler::java::ExtensionGenerator::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,bool immutable,
               ClassNameResolver *name_resolver,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  uint uVar3;
  Type field_type;
  mapped_type *pmVar4;
  Descriptor *pDVar5;
  char *pcVar6;
  FieldOptions *this;
  EnumDescriptor *descriptor_00;
  int i;
  int __c;
  int i_00;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  string *__s;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *name_resolver_00;
  allocator local_449;
  key_type local_448;
  allocator local_421;
  key_type local_420;
  byte local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  allocator local_3b1;
  key_type local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370;
  allocator local_349;
  key_type local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  undefined1 local_2e8 [8];
  string singular_type;
  JavaType java_type;
  allocator local_299;
  key_type local_298;
  allocator local_271;
  key_type local_270;
  allocator local_249;
  key_type local_248;
  allocator local_221;
  key_type local_220;
  byte local_1fa;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  key_type local_1d0;
  string local_1b0;
  allocator local_189;
  key_type local_188;
  string local_168;
  allocator local_141;
  key_type local_140;
  string local_120;
  allocator local_f9;
  key_type local_f8;
  string local_d8;
  allocator local_b1;
  key_type local_b0;
  string local_90;
  allocator local_59;
  key_type local_58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_pointer_local;
  ClassNameResolver *name_resolver_local;
  string *psStack_18;
  bool immutable_local;
  string *scope_local;
  FieldDescriptor *descriptor_local;
  
  name_resolver_00 = vars_pointer;
  local_38 = vars_pointer;
  vars = vars_pointer;
  vars_pointer_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)name_resolver;
  name_resolver_local._7_1_ = immutable;
  psStack_18 = scope;
  scope_local = (string *)descriptor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"scope",&local_59);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars_pointer,&local_58);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)scope);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  UnderscoresToCamelCase_abi_cxx11_(&local_90,(java *)scope_local,field);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_90);
  pmVar1 = vars_pointer_local;
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)scope_local);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_d8,(ClassNameResolver *)pmVar1,pDVar5,(bool)(name_resolver_local._7_1_ & 1));
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"containing_type",&local_f9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar3 = FieldDescriptor::number((FieldDescriptor *)scope_local);
  SimpleItoa_abi_cxx11_(&local_120,(protobuf *)(ulong)uVar3,i);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"number",&local_141);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_140);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string((string *)&local_120);
  FieldConstantName_abi_cxx11_(&local_168,(java *)scope_local,field_00);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"constant_name",&local_189);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_188);
  __s = &local_168;
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar6 = FieldDescriptor::index((FieldDescriptor *)scope_local,(char *)__s,__c);
  SimpleItoa_abi_cxx11_(&local_1b0,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"index",&local_1d1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_1d0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)scope_local);
  local_1fa = 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_1fa = 1;
    std::__cxx11::string::string((string *)&local_1f8,"",&local_1f9);
  }
  else {
    DefaultValue_abi_cxx11_
              (&local_1f8,(java *)scope_local,
               (FieldDescriptor *)(ulong)(name_resolver_local._7_1_ & 1),SUB81(vars_pointer_local,0)
               ,(ClassNameResolver *)name_resolver_00);
  }
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"default",&local_221);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_220);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  if ((local_1fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  field_type = GetType((FieldDescriptor *)scope_local);
  pcVar6 = FieldTypeName(field_type);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"type_constant",&local_249);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_248);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar6);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  this = FieldDescriptor::options((FieldDescriptor *)scope_local);
  bVar2 = FieldOptions::packed(this);
  pmVar1 = local_38;
  pcVar6 = "false";
  if (bVar2) {
    pcVar6 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"packed",&local_271);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_270);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar6);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"enum_map",&local_299);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_298);
  std::__cxx11::string::operator=((string *)pmVar4,"null");
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&java_type,"prototype",
             (allocator *)(singular_type.field_2._M_local_buf + 0xf));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,(key_type *)&java_type);
  std::__cxx11::string::operator=((string *)pmVar4,"null");
  std::__cxx11::string::~string((string *)&java_type);
  std::allocator<char>::~allocator((allocator<char> *)(singular_type.field_2._M_local_buf + 0xf));
  singular_type.field_2._8_4_ = GetJavaType((FieldDescriptor *)scope_local);
  std::__cxx11::string::string((string *)local_2e8);
  pmVar1 = vars_pointer_local;
  switch(singular_type.field_2._8_4_) {
  case 5:
    std::__cxx11::string::operator=((string *)local_2e8,"java.lang.String");
    break;
  case 6:
    pcVar6 = "byte[]";
    if ((name_resolver_local._7_1_ & 1) != 0) {
      pcVar6 = "com.google.protobuf.ByteString";
    }
    std::__cxx11::string::operator=((string *)local_2e8,pcVar6);
    break;
  case 7:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)scope_local);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_370,(ClassNameResolver *)pmVar1,descriptor_00,
               (bool)(name_resolver_local._7_1_ & 1));
    std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::operator+(&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                   ".internalGetValueMap()");
    pmVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"enum_map",&local_3b1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_3b0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::__cxx11::string::~string((string *)&local_390);
    break;
  case 8:
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)scope_local);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_308,(ClassNameResolver *)pmVar1,pDVar5,(bool)(name_resolver_local._7_1_ & 1));
    std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::operator+(&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                   ".getDefaultInstance()");
    pmVar1 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_348,"prototype",&local_349);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar1,&local_348);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    std::__cxx11::string::~string((string *)&local_328);
    break;
  default:
    pcVar6 = BoxedPrimitiveTypeName(singular_type.field_2._8_4_);
    std::__cxx11::string::operator=((string *)local_2e8,pcVar6);
  }
  local_3f9 = 0;
  bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)scope_local);
  if (bVar2) {
    std::operator+(&local_3f8,"java.util.List<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    local_3f9 = 1;
    std::operator+(&local_3d8,&local_3f8,">");
  }
  else {
    std::__cxx11::string::string((string *)&local_3d8,(string *)local_2e8);
  }
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"type",&local_421);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_420);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string((string *)&local_3d8);
  if ((local_3f9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  pmVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"singular_type",&local_449);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&local_448);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_2e8);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string((string *)local_2e8);
  return;
}

Assistant:

void ExtensionGenerator::InitTemplateVars(
    const FieldDescriptor* descriptor, const string& scope, bool immutable,
    ClassNameResolver* name_resolver, std::map<string, string>* vars_pointer) {
  std::map<string, string> &vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCase(descriptor);
  vars["containing_type"] =
      name_resolver->GetClassName(descriptor->containing_type(), immutable);
  vars["number"] = SimpleItoa(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = SimpleItoa(descriptor->index());
  vars["default"] = descriptor->is_repeated() ?
      "" : DefaultValue(descriptor, immutable, name_resolver);
  vars["type_constant"] = FieldTypeName(GetType(descriptor));
  vars["packed"] = descriptor->options().packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type = name_resolver->GetClassName(descriptor->message_type(),
                                                   immutable);
      vars["prototype"] = singular_type + ".getDefaultInstance()";
      break;
    case JAVATYPE_ENUM:
      singular_type = name_resolver->GetClassName(descriptor->enum_type(),
                                                   immutable);
      vars["enum_map"] = singular_type + ".internalGetValueMap()";
      break;
    case JAVATYPE_STRING:
      singular_type = "java.lang.String";
      break;
    case JAVATYPE_BYTES:
      singular_type = immutable ? "com.google.protobuf.ByteString" : "byte[]";
      break;
    default:
      singular_type = BoxedPrimitiveTypeName(java_type);
      break;
  }
  vars["type"] = descriptor->is_repeated() ?
      "java.util.List<" + singular_type + ">" : singular_type;
  vars["singular_type"] = singular_type;
}